

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int prvTidySaveConfigFile(TidyDocImpl *doc,ctmbstr cfgfil)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  FILE *__stream;
  StreamOut *out;
  
  uVar1 = (doc->config).value[0x39].v;
  uVar2 = (doc->config).value[0x3c].v;
  __stream = fopen(cfgfil,"wb");
  if (__stream == (FILE *)0x0) {
    iVar3 = -1;
  }
  else {
    out = prvTidyFileOutput(doc,(FILE *)__stream,(int)uVar2,(uint)uVar1);
    iVar3 = SaveConfigToStream(doc,out);
    fclose(__stream);
    (*doc->allocator->vtbl->free)(doc->allocator,out);
  }
  return iVar3;
}

Assistant:

int  TY_(SaveConfigFile)( TidyDocImpl* doc, ctmbstr cfgfil )
{
    int status = -1;
    StreamOut* out = NULL;
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    FILE* fout = fopen( cfgfil, "wb" );
    if ( fout )
    {
        out = TY_(FileOutput)( doc, fout, outenc, nl );
        status = SaveConfigToStream( doc, out );
        fclose( fout );
        TidyDocFree( doc, out );
    }
    return status;
}